

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O2

size_t __thiscall proto3_unittest::NestedTestAllTypes::ByteSizeLong(NestedTestAllTypes *this)

{
  anon_union_24_1_493b367e_for_NestedTestAllTypes_3 aVar1;
  size_t sVar2;
  size_t sVar3;
  
  aVar1 = this->field_0;
  if (((undefined1  [24])aVar1 & (undefined1  [24])0x3) == (undefined1  [24])0x0) {
    sVar3 = 0;
  }
  else {
    if (((undefined1  [24])aVar1 & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto3_unittest::NestedTestAllTypes>((this->field_0)._impl_.child_);
      sVar3 = sVar3 + 1;
    }
    if (((undefined1  [24])aVar1 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      sVar2 = google::protobuf::internal::WireFormatLite::MessageSize<proto3_unittest::TestAllTypes>
                        ((this->field_0)._impl_.payload_);
      sVar3 = sVar3 + sVar2 + 1;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t NestedTestAllTypes::ByteSizeLong() const {
  const NestedTestAllTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_unittest.NestedTestAllTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .proto3_unittest.NestedTestAllTypes child = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.child_);
    }
    // .proto3_unittest.TestAllTypes payload = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.payload_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}